

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_handle.c
# Opt level: O1

log_record log_handle_pop(log_handle handle)

{
  size_t sVar1;
  ulong uVar2;
  log_record plVar3;
  size_t sVar4;
  ulong __size;
  
  if (handle->count == 0) {
    return (log_record)0x0;
  }
  __size = handle->size >> 1;
  uVar2 = handle->count - 1;
  handle->count = uVar2;
  if (uVar2 < __size && 0x1ff < handle->size) {
    plVar3 = (log_record)realloc(handle->buffer,__size);
    if (plVar3 == (log_record)0x0) {
      return (log_record)0x0;
    }
    handle->buffer = plVar3;
    handle->size = __size;
  }
  plVar3 = handle->buffer;
  sVar1 = handle->count;
  sVar4 = log_record_size();
  return (log_record)((long)&plVar3->time + sVar4 * sVar1);
}

Assistant:

log_record log_handle_pop(log_handle handle)
{
	if (handle->count > 0)
	{
		const size_t new_size = handle->size >> 0x01;

		--handle->count;

		if (new_size >= LOG_HANDLE_RECORD_SIZE_DEFAULT && handle->count < new_size)
		{
			register void *buffer = realloc(handle->buffer, new_size);

			if (buffer == NULL)
			{
				return NULL;
			}

			handle->buffer = buffer;

			handle->size = new_size;
		}

		return (void *const)((unsigned char *)(handle->buffer) + (handle->count * log_record_size()));
	}

	return NULL;
}